

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

Loss * __thiscall xLearn::Solver::create_loss(Solver *this)

{
  char *pcVar1;
  ostream *poVar2;
  ObjectCreatorRegistry_xLearn_loss_registry *in_RDI;
  Loss *loss;
  allocator *this_00;
  string *in_stack_ffffffffffffff40;
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa4;
  string *in_stack_ffffffffffffffa8;
  LogSeverity in_stack_ffffffffffffffb4;
  Logger local_48 [5];
  allocator local_31;
  string local_30 [32];
  Loss *local_10;
  
  GetRegistry_xLearn_loss_registry();
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,pcVar1,&local_31);
  local_10 = ObjectCreatorRegistry_xLearn_loss_registry::CreateObject
                       (in_RDI,in_stack_ffffffffffffff40);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if (local_10 == (Loss *)0x0) {
    Logger::Logger(local_48,FATAL);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff98,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/solver.cc"
               ,&local_69);
    this_00 = &local_91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"create_loss",this_00);
    poVar2 = Logger::Start(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
                           in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98);
    poVar2 = std::operator<<(poVar2,"Cannot create loss: ");
    std::operator<<(poVar2,(string *)
                           &(in_RDI->m_creator_registry)._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_right);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    Logger::~Logger((Logger *)this_00);
  }
  return local_10;
}

Assistant:

Loss* Solver::create_loss() {
  Loss* loss;
  loss = CREATE_LOSS(hyper_param_.loss_func.c_str());
  if (loss == nullptr) {
    LOG(FATAL) << "Cannot create loss: "
               << hyper_param_.loss_func;
  }
  return loss;
}